

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByName(Descriptor *this,string *key)

{
  size_type __bkt;
  FieldDescriptor *pFVar1;
  long lVar2;
  __node_ptr p_Var3;
  char cVar4;
  FieldDescriptor *pFVar5;
  char *pcVar6;
  
  pcVar6 = (key->_M_dataplus)._M_p;
  __bkt = (*(undefined8 **)(*(long *)(this + 0x10) + 0xa8))[1];
  cVar4 = *pcVar6;
  if (cVar4 == '\0') {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    do {
      pcVar6 = pcVar6 + 1;
      lVar2 = (long)cVar4 + lVar2 * 5;
      cVar4 = *pcVar6;
    } while (cVar4 != '\0');
  }
  p_Var3 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)**(undefined8 **)(*(long *)(this + 0x10) + 0xa8),__bkt,
                          (key_type *)((ulong)((long)this * 0xffff + lVar2) % __bkt),
                          (__hash_code)this);
  pFVar5 = (FieldDescriptor *)0x0;
  if (p_Var3 != (__node_ptr)0x0) {
    if (*(int *)((long)&(p_Var3->
                        super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                        ._M_storage._M_storage + 0x10) == 2) {
      pFVar1 = *(FieldDescriptor **)
                ((long)&(p_Var3->
                        super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                        ._M_storage._M_storage + 0x18);
      pFVar5 = (FieldDescriptor *)0x0;
      if (pFVar1[0x50] == (FieldDescriptor)0x0) {
        pFVar5 = pFVar1;
      }
    }
    else {
      pFVar5 = (FieldDescriptor *)0x0;
    }
  }
  return pFVar5;
}

Assistant:

const FieldDescriptor*
Descriptor::FindFieldByName(const string& key) const {
  Symbol result =
    file()->tables_->FindNestedSymbolOfType(this, key, Symbol::FIELD);
  if (!result.IsNull() && !result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return NULL;
  }
}